

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext
          (RunContext *this,Ptr<const_Catch::IConfig> *config,
          Ptr<Catch::IStreamingReporter> *reporter)

{
  int iVar1;
  IConfig *pIVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IStreamingReporter *pIVar4;
  string local_40 [32];
  Ptr<Catch::IStreamingReporter> *local_20;
  Ptr<Catch::IStreamingReporter> *reporter_local;
  Ptr<const_Catch::IConfig> *config_local;
  RunContext *this_local;
  
  local_20 = reporter;
  reporter_local = (Ptr<Catch::IStreamingReporter> *)config;
  config_local = (Ptr<const_Catch::IConfig> *)this;
  IResultCapture::IResultCapture(&this->super_IResultCapture);
  IRunner::IRunner(&this->super_IRunner);
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_002b9c28;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&DAT_002b9c90;
  pIVar2 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)reporter_local);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_40);
  TestRunInfo::TestRunInfo(&this->m_runInfo,local_40);
  std::__cxx11::string::~string((string *)local_40);
  pIVar3 = getCurrentMutableContext();
  this->m_context = pIVar3;
  this->m_activeTestCase = (TestCase *)0x0;
  Option<Catch::SectionTracking::TestCaseTracker>::Option(&this->m_testCaseTracker);
  AssertionResult::AssertionResult(&this->m_lastResult);
  Ptr<const_Catch::IConfig>::Ptr(&this->m_config,(Ptr<const_Catch::IConfig> *)reporter_local);
  Totals::Totals(&this->m_totals);
  Ptr<Catch::IStreamingReporter>::Ptr(&this->m_reporter,local_20);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector(&this->m_messages);
  iVar1 = (*(this->m_context->super_IContext)._vptr_IContext[3])();
  this->m_prevRunner = (IRunner *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->m_context->super_IContext)._vptr_IContext[2])();
  this->m_prevResultCapture = (IResultCapture *)CONCAT44(extraout_var_00,iVar1);
  (*(this->m_context->super_IContext)._vptr_IContext[6])();
  AssertionInfo::AssertionInfo(&this->m_lastAssertionInfo);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::vector(&this->m_unfinishedSections);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,&this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[7])();
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar4,&this->m_runInfo);
  return;
}

Assistant:

explicit RunContext( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> const& reporter )
        :   m_runInfo( config->name() ),
            m_context( getCurrentMutableContext() ),
            m_activeTestCase( NULL ),
            m_config( config ),
            m_reporter( reporter ),
            m_prevRunner( m_context.getRunner() ),
            m_prevResultCapture( m_context.getResultCapture() ),
            m_prevConfig( m_context.getConfig() )
        {
            m_context.setRunner( this );
            m_context.setConfig( m_config );
            m_context.setResultCapture( this );
            m_reporter->testRunStarting( m_runInfo );
        }